

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

void __thiscall Cmd::loadHistory(Cmd *this)

{
  istream *piVar1;
  string line;
  ifstream file;
  
  if ((this->history_file_).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::ifstream::ifstream((istream *)&file,(string *)&this->history_file_,_S_in);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&file,(string *)&line);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      addHistoryEntry(this,&line);
    }
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&file);
  }
  return;
}

Assistant:

void loadHistory() {
		if (history_file_) {
			std::ifstream file(*history_file_);
			for (std::string line; std::getline(file, line);) {
				addHistoryEntry(line);
			}
		}
	}